

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O0

void __thiscall suisha::t_loop::f_post(t_loop *this,function<void_()> *a_function)

{
  function<void_()> *this_00;
  function<void_()> *local_20;
  function<void_()> *p;
  function<void_()> *a_function_local;
  t_loop *this_local;
  
  p = a_function;
  a_function_local = (function<void_()> *)this;
  this_00 = (function<void_()> *)operator_new(0x20);
  std::function<void_()>::function(this_00,p);
  local_20 = this_00;
  write(*(int *)(this + 0x28),&local_20,8);
  return;
}

Assistant:

void f_post(std::function<void()>&& a_function)
	{
		auto p = new std::function<void()>(std::move(a_function));
		write(v_post, &p, sizeof(p));
	}